

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void CountUniqueBoardPositions<uttt::IBoard>(int depth)

{
  initializer_list<uttt::IBoard> __l;
  bool bVar1;
  int iVar2;
  ostream *poVar3;
  reference plVar4;
  size_type sVar5;
  size_type sVar6;
  int in_EDI;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  pair<std::__detail::_Node_iterator<uttt::IBoard,_true,_true>,_bool> pVar10;
  pair<std::__detail::_Node_iterator<long_long,_true,_false>,_bool> pVar11;
  rep millis;
  time_point t2;
  IBoard ng;
  long m;
  iterator __end0_1;
  iterator __begin0_1;
  vector<long,_std::allocator<long>_> *__range3;
  vector<long,_std::allocator<long>_> moves;
  IBoard *g;
  iterator __end0;
  iterator __begin0;
  unordered_set<uttt::IBoard,_std::hash<uttt::IBoard>,_std::equal_to<uttt::IBoard>,_std::allocator<uttt::IBoard>_>
  *__range2;
  time_point t1;
  unordered_set<long_long,_std::hash<long_long>,_std::equal_to<long_long>,_std::allocator<long_long>_>
  unique_hashes;
  int i;
  int set_ind;
  unordered_set<uttt::IBoard,_std::hash<uttt::IBoard>,_std::equal_to<uttt::IBoard>,_std::allocator<uttt::IBoard>_>
  sets [2];
  longlong total;
  unordered_set<uttt::IBoard,_std::hash<uttt::IBoard>,_std::equal_to<uttt::IBoard>,_std::allocator<uttt::IBoard>_>
  *in_stack_fffffffffffffce8;
  IBoard *in_stack_fffffffffffffcf0;
  iterator in_stack_fffffffffffffcf8;
  IBoard *in_stack_fffffffffffffd00;
  undefined1 *local_2f0;
  IBoard *in_stack_fffffffffffffd20;
  IBoard *in_stack_fffffffffffffd58;
  undefined1 *local_1c8;
  duration<long,_std::ratio<1L,_1000L>_> local_1b8;
  rep local_1b0;
  undefined8 local_1a8;
  _Node_iterator_base<long_long,_false> local_1a0;
  undefined1 local_198;
  size_t local_190;
  _Node_iterator_base<uttt::IBoard,_true> local_188;
  undefined1 local_180;
  undefined8 local_178;
  undefined8 uStack_170;
  undefined8 local_168;
  long local_160;
  long *local_158;
  __normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_> local_150;
  undefined1 *local_148;
  undefined1 local_140 [24];
  reference local_128;
  _Node_iterator_base<uttt::IBoard,_true> local_120;
  _Node_iterator_base<uttt::IBoard,_true> local_118;
  undefined1 *local_110;
  undefined8 local_108;
  int local_c4;
  int local_c0;
  undefined1 local_b0 [24];
  undefined1 *local_98;
  undefined8 local_90;
  undefined1 local_88 [112];
  undefined1 auStack_18 [8];
  long local_10;
  int local_4;
  
  local_4 = in_EDI;
  poVar3 = std::operator<<((ostream *)&std::cout,"Game size: ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x18);
  std::operator<<(poVar3," bytes\n");
  local_10 = 1;
  local_1c8 = local_88;
  do {
    std::
    unordered_set<uttt::IBoard,_std::hash<uttt::IBoard>,_std::equal_to<uttt::IBoard>,_std::allocator<uttt::IBoard>_>
    ::unordered_set((unordered_set<uttt::IBoard,_std::hash<uttt::IBoard>,_std::equal_to<uttt::IBoard>,_std::allocator<uttt::IBoard>_>
                     *)0x1f949d);
    local_1c8 = local_1c8 + 0x38;
  } while (local_1c8 != auStack_18);
  uttt::IBoard::IBoard(in_stack_fffffffffffffcf0);
  local_98 = local_b0;
  local_90 = 1;
  __l._M_len = (size_type)in_stack_fffffffffffffd00;
  __l._M_array = in_stack_fffffffffffffcf8;
  std::
  unordered_set<uttt::IBoard,_std::hash<uttt::IBoard>,_std::equal_to<uttt::IBoard>,_std::allocator<uttt::IBoard>_>
  ::insert((unordered_set<uttt::IBoard,_std::hash<uttt::IBoard>,_std::equal_to<uttt::IBoard>,_std::allocator<uttt::IBoard>_>
            *)in_stack_fffffffffffffcf0,__l);
  local_c0 = 0;
  for (local_c4 = 0; local_c4 < local_4; local_c4 = local_c4 + 1) {
    std::
    unordered_set<long_long,_std::hash<long_long>,_std::equal_to<long_long>,_std::allocator<long_long>_>
    ::unordered_set((unordered_set<long_long,_std::hash<long_long>,_std::equal_to<long_long>,_std::allocator<long_long>_>
                     *)0x1f954f);
    poVar3 = std::operator<<((ostream *)&std::cout,"Working on depth: ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_c4 + 1);
    std::operator<<(poVar3,'\n');
    std::
    unordered_set<uttt::IBoard,_std::hash<uttt::IBoard>,_std::equal_to<uttt::IBoard>,_std::allocator<uttt::IBoard>_>
    ::clear((unordered_set<uttt::IBoard,_std::hash<uttt::IBoard>,_std::equal_to<uttt::IBoard>,_std::allocator<uttt::IBoard>_>
             *)0x1f95c2);
    local_108 = std::chrono::_V2::system_clock::now();
    local_110 = local_88 + (long)local_c0 * 0x38;
    local_118._M_cur =
         (__node_type *)
         std::
         unordered_set<uttt::IBoard,_std::hash<uttt::IBoard>,_std::equal_to<uttt::IBoard>,_std::allocator<uttt::IBoard>_>
         ::begin(in_stack_fffffffffffffce8);
    local_120._M_cur =
         (__node_type *)
         std::
         unordered_set<uttt::IBoard,_std::hash<uttt::IBoard>,_std::equal_to<uttt::IBoard>,_std::allocator<uttt::IBoard>_>
         ::end(in_stack_fffffffffffffce8);
    while (bVar1 = std::__detail::operator!=(&local_118,&local_120), bVar1) {
      local_128 = std::__detail::_Node_iterator<uttt::IBoard,_true,_true>::operator*
                            ((_Node_iterator<uttt::IBoard,_true,_true> *)0x1f9643);
      iVar2 = uttt::IBoard::GetStatus(local_128);
      if (iVar2 == -1) {
        uttt::IBoard::GetPossibleMoves(in_stack_fffffffffffffd58);
        local_148 = local_140;
        local_150._M_current =
             (long *)std::vector<long,_std::allocator<long>_>::begin
                               ((vector<long,_std::allocator<long>_> *)in_stack_fffffffffffffce8);
        local_158 = (long *)std::vector<long,_std::allocator<long>_>::end
                                      ((vector<long,_std::allocator<long>_> *)
                                       in_stack_fffffffffffffce8);
        while (bVar1 = __gnu_cxx::operator!=
                                 ((__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>
                                   *)in_stack_fffffffffffffcf0,
                                  (__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>
                                   *)in_stack_fffffffffffffce8), bVar1) {
          plVar4 = __gnu_cxx::__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>::
                   operator*(&local_150);
          local_160 = *plVar4;
          local_168 = *(undefined8 *)((local_128->micro)._M_elems + 6);
          local_178._0_4_ = local_128->macro;
          local_178._4_2_ = (local_128->micro)._M_elems[0];
          local_178._6_2_ = (local_128->micro)._M_elems[1];
          uStack_170 = *(undefined8 *)((local_128->micro)._M_elems + 2);
          uttt::IBoard::ApplyMove(in_stack_fffffffffffffd00,(IMove *)in_stack_fffffffffffffcf8);
          pVar10 = std::
                   unordered_set<uttt::IBoard,std::hash<uttt::IBoard>,std::equal_to<uttt::IBoard>,std::allocator<uttt::IBoard>>
                   ::emplace<uttt::IBoard&>
                             ((unordered_set<uttt::IBoard,_std::hash<uttt::IBoard>,_std::equal_to<uttt::IBoard>,_std::allocator<uttt::IBoard>_>
                               *)in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8);
          local_188._M_cur =
               (__node_type *)pVar10.first.super__Node_iterator_base<uttt::IBoard,_true>._M_cur;
          local_180 = pVar10.second;
          local_190 = uttt::IBoard::Hash(in_stack_fffffffffffffd20);
          pVar11 = std::
                   unordered_set<long_long,_std::hash<long_long>,_std::equal_to<long_long>,_std::allocator<long_long>_>
                   ::emplace<unsigned_long>
                             ((unordered_set<long_long,_std::hash<long_long>,_std::equal_to<long_long>,_std::allocator<long_long>_>
                               *)in_stack_fffffffffffffd00,
                              (unsigned_long *)in_stack_fffffffffffffcf8);
          local_1a0._M_cur =
               (__node_type *)pVar11.first.super__Node_iterator_base<long_long,_false>._M_cur;
          local_198 = pVar11.second;
          __gnu_cxx::__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>::
          operator++(&local_150);
        }
        std::vector<long,_std::allocator<long>_>::~vector
                  ((vector<long,_std::allocator<long>_> *)in_stack_fffffffffffffd00);
      }
      std::__detail::_Node_iterator<uttt::IBoard,_true,_true>::operator++
                ((_Node_iterator<uttt::IBoard,_true,_true> *)in_stack_fffffffffffffcf0);
    }
    local_1a8 = std::chrono::_V2::system_clock::now();
    std::chrono::operator-
              ((time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                *)in_stack_fffffffffffffcf8,
               (time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                *)in_stack_fffffffffffffcf0);
    local_1b8.__r =
         (rep)std::chrono::
              duration_cast<std::chrono::duration<long,std::ratio<1l,1000l>>,long,std::ratio<1l,1000000000l>>
                        ((duration<long,_std::ratio<1L,_1000000000L>_> *)in_stack_fffffffffffffce8);
    local_1b0 = std::chrono::duration<long,_std::ratio<1L,_1000L>_>::count(&local_1b8);
    sVar5 = std::
            unordered_set<uttt::IBoard,_std::hash<uttt::IBoard>,_std::equal_to<uttt::IBoard>,_std::allocator<uttt::IBoard>_>
            ::size((unordered_set<uttt::IBoard,_std::hash<uttt::IBoard>,_std::equal_to<uttt::IBoard>,_std::allocator<uttt::IBoard>_>
                    *)0x1f9914);
    local_10 = local_10 + sVar5;
    poVar3 = std::operator<<((ostream *)&std::cout,"Current depth hash count: ");
    sVar6 = std::
            unordered_set<long_long,_std::hash<long_long>,_std::equal_to<long_long>,_std::allocator<long_long>_>
            ::size((unordered_set<long_long,_std::hash<long_long>,_std::equal_to<long_long>,_std::allocator<long_long>_>
                    *)0x1f9954);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,sVar6);
    poVar3 = std::operator<<(poVar3," / ");
    sVar5 = std::
            unordered_set<uttt::IBoard,_std::hash<uttt::IBoard>,_std::equal_to<uttt::IBoard>,_std::allocator<uttt::IBoard>_>
            ::size((unordered_set<uttt::IBoard,_std::hash<uttt::IBoard>,_std::equal_to<uttt::IBoard>,_std::allocator<uttt::IBoard>_>
                    *)0x1f99ad);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,sVar5);
    poVar3 = std::operator<<(poVar3," = ");
    sVar6 = std::
            unordered_set<long_long,_std::hash<long_long>,_std::equal_to<long_long>,_std::allocator<long_long>_>
            ::size((unordered_set<long_long,_std::hash<long_long>,_std::equal_to<long_long>,_std::allocator<long_long>_>
                    *)0x1f99f2);
    auVar7._8_4_ = (int)(sVar6 >> 0x20);
    auVar7._0_8_ = sVar6;
    auVar7._12_4_ = 0x45300000;
    sVar5 = std::
            unordered_set<uttt::IBoard,_std::hash<uttt::IBoard>,_std::equal_to<uttt::IBoard>,_std::allocator<uttt::IBoard>_>
            ::size((unordered_set<uttt::IBoard,_std::hash<uttt::IBoard>,_std::equal_to<uttt::IBoard>,_std::allocator<uttt::IBoard>_>
                    *)0x1f9a5f);
    auVar9._8_4_ = (int)(sVar5 >> 0x20);
    auVar9._0_8_ = sVar5;
    auVar9._12_4_ = 0x45300000;
    poVar3 = (ostream *)
             std::ostream::operator<<
                       (poVar3,(((auVar7._8_8_ - 1.9342813113834067e+25) +
                                ((double)CONCAT44(0x43300000,(int)sVar6) - 4503599627370496.0)) *
                               100.0) / ((auVar9._8_8_ - 1.9342813113834067e+25) +
                                        ((double)CONCAT44(0x43300000,(int)sVar5) -
                                        4503599627370496.0)));
    std::operator<<(poVar3,"%\n");
    poVar3 = std::operator<<((ostream *)&std::cout,"Current depth node count: ");
    sVar5 = std::
            unordered_set<uttt::IBoard,_std::hash<uttt::IBoard>,_std::equal_to<uttt::IBoard>,_std::allocator<uttt::IBoard>_>
            ::size((unordered_set<uttt::IBoard,_std::hash<uttt::IBoard>,_std::equal_to<uttt::IBoard>,_std::allocator<uttt::IBoard>_>
                    *)0x1f9aff);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,sVar5);
    poVar3 = std::operator<<(poVar3,", size: ");
    sVar5 = std::
            unordered_set<uttt::IBoard,_std::hash<uttt::IBoard>,_std::equal_to<uttt::IBoard>,_std::allocator<uttt::IBoard>_>
            ::size((unordered_set<uttt::IBoard,_std::hash<uttt::IBoard>,_std::equal_to<uttt::IBoard>,_std::allocator<uttt::IBoard>_>
                    *)0x1f9b55);
    in_stack_fffffffffffffd58 = (IBoard *)std::ostream::operator<<(poVar3,sVar5 * 0x18 >> 0x14);
    std::operator<<((ostream *)in_stack_fffffffffffffd58,"MB\n");
    poVar3 = std::operator<<((ostream *)&std::cout,"Current depth duration  : ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_1b0 / 1000);
    poVar3 = std::operator<<(poVar3," seconds ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_1b0 % 1000);
    poVar3 = std::operator<<(poVar3," milliseconds, ");
    sVar5 = std::
            unordered_set<uttt::IBoard,_std::hash<uttt::IBoard>,_std::equal_to<uttt::IBoard>,_std::allocator<uttt::IBoard>_>
            ::size((unordered_set<uttt::IBoard,_std::hash<uttt::IBoard>,_std::equal_to<uttt::IBoard>,_std::allocator<uttt::IBoard>_>
                    *)0x1f9c6b);
    auVar8._8_4_ = (int)(sVar5 >> 0x20);
    auVar8._0_8_ = sVar5;
    auVar8._12_4_ = 0x45300000;
    poVar3 = (ostream *)
             std::ostream::operator<<
                       (poVar3,(((auVar8._8_8_ - 1.9342813113834067e+25) +
                                ((double)CONCAT44(0x43300000,(int)sVar5) - 4503599627370496.0)) /
                               (double)local_1b0) * 1000.0);
    std::operator<<(poVar3," nps\n");
    in_stack_fffffffffffffd20 =
         (IBoard *)std::operator<<((ostream *)&std::cout,"Total count             : ");
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)in_stack_fffffffffffffd20,local_10);
    std::operator<<(poVar3,'\n');
    local_c0 = 1 - local_c0;
    std::
    unordered_set<long_long,_std::hash<long_long>,_std::equal_to<long_long>,_std::allocator<long_long>_>
    ::~unordered_set((unordered_set<long_long,_std::hash<long_long>,_std::equal_to<long_long>,_std::allocator<long_long>_>
                      *)0x1f9d34);
  }
  local_2f0 = auStack_18;
  do {
    local_2f0 = local_2f0 + -0x38;
    std::
    unordered_set<uttt::IBoard,_std::hash<uttt::IBoard>,_std::equal_to<uttt::IBoard>,_std::allocator<uttt::IBoard>_>
    ::~unordered_set((unordered_set<uttt::IBoard,_std::hash<uttt::IBoard>,_std::equal_to<uttt::IBoard>,_std::allocator<uttt::IBoard>_>
                      *)0x1f9d82);
  } while (local_2f0 != local_88);
  return;
}

Assistant:

void
CountUniqueBoardPositions(int depth)
{
    std::cout << "Game size: " << sizeof(IGame) << " bytes\n";
    long long total = 1;
    std::unordered_set<IGame> sets[2];
    sets[0].insert({{}});
    int set_ind = 0;
    for (int i = 0; i < depth; ++i)
    {
        std::unordered_set<long long> unique_hashes;
        std::cout << "Working on depth: " << i + 1 << '\n';
        sets[1 - set_ind].clear();
        auto t1 = std::chrono::high_resolution_clock::now();
        for (const auto &g : sets[set_ind])
        {
            if (g.GetStatus() != game::Undecided)
                continue;
            auto moves = g.GetPossibleMoves();
            for (auto m : moves)
            {
                auto ng = g;
                ng.ApplyMove(m);
                sets[1 - set_ind].emplace(ng);
                unique_hashes.emplace(ng.Hash());
            }
        }
        auto t2 = std::chrono::high_resolution_clock::now();
        auto millis = std::chrono::duration_cast<std::chrono::milliseconds>(t2 - t1).count();
        total += sets[1 - set_ind].size();
        std::cout << "Current depth hash count: " << unique_hashes.size() << " / " << sets[1 - set_ind].size() << " = " << double(unique_hashes.size()) * 100.0 / sets[1 - set_ind].size() << "%\n";
        std::cout << "Current depth node count: " << sets[1 - set_ind].size() << ", size: " << sets[1 - set_ind].size() * sizeof(IGame) / (1 << 20) << "MB\n";
        std::cout << "Current depth duration  : " << millis / 1000 << " seconds " << millis % 1000 << " milliseconds, " << double(sets[1 - set_ind].size()) / millis * 1000 << " nps\n";
        std::cout << "Total count             : " << total << '\n';
        set_ind = 1 - set_ind;
    }
}